

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializationWrapper.cpp
# Opt level: O2

void fs_add_serializer_metainfo_d(void *serializer,char *name,int name_length,double value)

{
  string local_30;
  
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,name,name + name_length);
  ser::Serializer::AddMetainfo<double>((Serializer *)serializer,&local_30,value);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void fs_add_serializer_metainfo_d(void* serializer, const char* name, int name_length, double value)
{
    reinterpret_cast<Serializer*>(serializer)->AddMetainfo(std::string(name, name_length), value);
}